

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

unique_ptr<pbrt::VolPathIntegrator,_std::default_delete<pbrt::VolPathIntegrator>_>
pbrt::VolPathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  int iVar1;
  PrimitiveHandle *in_RCX;
  SamplerHandle *in_RDX;
  string *in_RSI;
  VolPathIntegrator *in_RDI;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_R8;
  Float FVar2;
  bool regularize;
  string lightStrategy;
  Float rrThreshold;
  int maxDepth;
  string *in_stack_fffffffffffffe28;
  ParameterDictionary *in_stack_fffffffffffffe30;
  allocator<char> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  string *def;
  string *name;
  undefined4 in_stack_fffffffffffffe88;
  _Head_base<0UL,_pbrt::VolPathIntegrator_*,_false> __args;
  float *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  bool *in_stack_fffffffffffffee0;
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [39];
  undefined1 local_91 [33];
  Float local_70;
  allocator<char> local_59;
  string local_58 [36];
  int local_34;
  string *local_10;
  
  __args._M_head_impl = in_RDI;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,in_stack_fffffffffffffe60);
  iVar1 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  name = (string *)local_91;
  def = local_10;
  local_34 = iVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),in_stack_fffffffffffffe68
             ,in_stack_fffffffffffffe60);
  FVar2 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,0.0);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  __s = &local_d9;
  local_70 = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar2,in_stack_fffffffffffffe70),(char *)__s,(allocator<char> *)local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar2,in_stack_fffffffffffffe70),(char *)__s,(allocator<char> *)local_10);
  ParameterDictionary::GetOneString
            ((ParameterDictionary *)CONCAT44(iVar1,in_stack_fffffffffffffe88),name,def);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(FVar2,in_stack_fffffffffffffe70),(char *)__s,(allocator<char> *)local_10);
  ParameterDictionary::GetOneBool(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,false);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
  std::
  make_unique<pbrt::VolPathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,float&,std::__cxx11::string&,bool&>
            ((int *)__args._M_head_impl,(CameraHandle *)in_RDI,in_RDX,in_RCX,in_R8,
             in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_b8);
  return (__uniq_ptr_data<pbrt::VolPathIntegrator,_std::default_delete<pbrt::VolPathIntegrator>,_true,_true>
          )(tuple<pbrt::VolPathIntegrator_*,_std::default_delete<pbrt::VolPathIntegrator>_>)
           __args._M_head_impl;
}

Assistant:

std::unique_ptr<VolPathIntegrator> VolPathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    Float rrThreshold = parameters.GetOneFloat("rrthreshold", 1.);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<VolPathIntegrator>(maxDepth, camera, sampler, aggregate,
                                               lights, rrThreshold, lightStrategy,
                                               regularize);
}